

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorTiledVertical::GenerateElementData
          (DecoratorTiledVertical *this,Element *element,BoxArea paint_area)

{
  int iVar1;
  Vector2f VVar2;
  ComputedValues *computed_00;
  RenderManager *pRVar3;
  float fVar4;
  float fVar5;
  Texture texture;
  Mesh *local_278;
  Mesh *local_1f0;
  undefined1 local_1d0 [28];
  int i_1;
  RenderManager *render_manager;
  DecoratorTiledVerticalData *data;
  Vector2f VStack_1a0;
  int num_textures;
  Vector2f local_198;
  Vector2<float> local_190;
  Vector2<float> local_188;
  Vector2f local_180;
  Vector2f local_174;
  Vector2<float> local_16c;
  Vector2f local_164;
  Vector2f local_150;
  Vector2f local_148;
  Vector2f local_140;
  undefined1 local_138 [8];
  Mesh mesh [3];
  ComputedValues *computed;
  float fStack_90;
  float minimum_height;
  Vector2f centre_dimensions;
  Vector2f bottom_dimensions;
  Vector2f top_dimensions;
  Vector2f size;
  Vector2f offset;
  RenderBox render_box;
  int local_28;
  int i;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorTiledVertical *this_local;
  
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    texture = Decorator::GetTexture
                        ((Decorator *)this,*(int *)(&this->field_0x30 + (long)local_28 * 0x4c));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)(&this->field_0x30 + (long)local_28 * 0x4c),texture);
  }
  Element::GetRenderBox((RenderBox *)&offset,element,paint_area,0);
  size = RenderBox::GetFillOffset((RenderBox *)&offset);
  VVar2 = RenderBox::GetFillSize((RenderBox *)&offset);
  bottom_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x30,element);
  centre_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x7c,element);
  _fStack_90 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0xc8,element);
  top_dimensions.x = VVar2.x;
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&bottom_dimensions,top_dimensions.x,Horizontal);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&centre_dimensions,top_dimensions.x,Horizontal);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,(Vector2f *)&stack0xffffffffffffff70,top_dimensions.x,
             Horizontal);
  fVar4 = Math::Round(bottom_dimensions.y);
  bottom_dimensions.y = fVar4;
  fVar4 = Math::Round(centre_dimensions.y);
  top_dimensions.y = VVar2.y;
  if (top_dimensions.y < bottom_dimensions.y + fVar4) {
    fVar5 = bottom_dimensions.y + fVar4;
    bottom_dimensions.y = top_dimensions.y * (bottom_dimensions.y / fVar5);
    fVar4 = top_dimensions.y * (fVar4 / fVar5);
  }
  centre_dimensions.y = fVar4;
  computed_00 = Element::GetComputedValues(element);
  local_1f0 = (Mesh *)local_138;
  do {
    Mesh::Mesh(local_1f0);
    local_1f0 = local_1f0 + 1;
  } while (local_1f0 !=
           (Mesh *)&mesh[2].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  local_140 = size;
  local_148 = bottom_dimensions;
  local_150 = bottom_dimensions;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)&this->field_0x30,
             (Mesh *)&mesh[(long)*(int *)&this->field_0x30 + -1].indices.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,computed_00,size,bottom_dimensions,bottom_dimensions);
  iVar1 = *(int *)&this->field_0xc8;
  Vector2<float>::Vector2(&local_16c,0.0,bottom_dimensions.y);
  local_164 = Vector2<float>::operator+(&size,local_16c);
  Vector2<float>::Vector2
            (&local_174,fStack_90,top_dimensions.y - (bottom_dimensions.y + centre_dimensions.y));
  local_180 = _fStack_90;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)&this->field_0xc8,
             (Mesh *)&mesh[(long)iVar1 + -1].indices.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,computed_00,local_164,
             local_174,_fStack_90);
  iVar1 = *(int *)&this->field_0x7c;
  Vector2<float>::Vector2(&local_190,0.0,top_dimensions.y - centre_dimensions.y);
  local_188 = Vector2<float>::operator+(&size,local_190);
  local_198 = centre_dimensions;
  VStack_1a0 = centre_dimensions;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)&this->field_0x7c,
             (Mesh *)&mesh[(long)iVar1 + -1].indices.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,computed_00,local_188,
             centre_dimensions,centre_dimensions);
  data._4_4_ = Decorator::GetNumTextures((Decorator *)this);
  pRVar3 = (RenderManager *)operator_new(0x10);
  DecoratorTiledVerticalData::DecoratorTiledVerticalData
            ((DecoratorTiledVerticalData *)pRVar3,data._4_4_);
  render_manager = pRVar3;
  register0x00000000 = Element::GetRenderManager(element);
  for (local_1d0._20_4_ = 0; pRVar3 = render_manager, (int)local_1d0._20_4_ < data._4_4_;
      local_1d0._20_4_ = local_1d0._20_4_ + 1) {
    RenderManager::MakeGeometry((RenderManager *)local_1d0,(Mesh *)stack0xfffffffffffffe48);
    Geometry::operator=((Geometry *)
                        ((long)&(((render_manager->geometry_list).elements.
                                  super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices +
                        (long)(int)local_1d0._20_4_ * 0x10),(Geometry *)local_1d0);
    Geometry::~Geometry((Geometry *)local_1d0);
  }
  local_278 = (Mesh *)&mesh[2].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  do {
    local_278 = local_278 + -1;
    Mesh::~Mesh(local_278);
  } while (local_278 != (Mesh *)local_138);
  return (DecoratorDataHandle)pRVar3;
}

Assistant:

DecoratorDataHandle DecoratorTiledVertical::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tile for this element.
	for (int i = 0; i < 3; i++)
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector2f top_dimensions = tiles[TOP].GetNaturalDimensions(element);
	Vector2f bottom_dimensions = tiles[BOTTOM].GetNaturalDimensions(element);
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);

	// Scale the tile sizes by the width scale.
	ScaleTileDimensions(top_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(bottom_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(centre_dimensions, size.x, Axis::Horizontal);

	// Round the outer tile heights now so that we don't get gaps when rounding again in GenerateGeometry.
	top_dimensions.y = Math::Round(top_dimensions.y);
	bottom_dimensions.y = Math::Round(bottom_dimensions.y);

	// Shrink the y-sizes on the left and right tiles if necessary.
	if (size.y < top_dimensions.y + bottom_dimensions.y)
	{
		float minimum_height = top_dimensions.y + bottom_dimensions.y;
		top_dimensions.y = size.y * (top_dimensions.y / minimum_height);
		bottom_dimensions.y = size.y * (bottom_dimensions.y / minimum_height);
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	tiles[TOP].GenerateGeometry(mesh[tiles[TOP].texture_index], computed, offset, top_dimensions, top_dimensions);

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(0, top_dimensions.y),
		Vector2f(centre_dimensions.x, size.y - (top_dimensions.y + bottom_dimensions.y)), centre_dimensions);

	tiles[BOTTOM].GenerateGeometry(mesh[tiles[BOTTOM].texture_index], computed, offset + Vector2f(0, size.y - bottom_dimensions.y), bottom_dimensions,
		bottom_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledVerticalData* data = new DecoratorTiledVerticalData(num_textures);

	// Set the mesh and textures on the geometry.
	RenderManager* render_manager = element->GetRenderManager();
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}